

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O1

string * tinyusdz::io::FindFile
                   (string *__return_storage_ptr__,string *filename,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *search_paths)

{
  pointer pcVar1;
  bool bVar2;
  void *extraout_RDX;
  pointer pbVar3;
  string *psVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  string local_50;
  
  if ((void *)filename->_M_string_length == (void *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar1,pcVar1);
    return __return_storage_ptr__;
  }
  if ((search_paths->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (search_paths->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    psVar4 = filename;
    ExpandFilePath(__return_storage_ptr__,filename,(void *)filename->_M_string_length);
    bVar7 = FileExists(__return_storage_ptr__,psVar4);
    if (bVar7) {
      return __return_storage_ptr__;
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &__return_storage_ptr__->field_2) {
      operator_delete(pcVar1,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
    }
    if (bVar7) {
      return __return_storage_ptr__;
    }
  }
  pbVar3 = (search_paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar7 = (search_paths->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pbVar3;
  if (bVar7) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      psVar4 = &local_50;
      JoinPath(psVar4,(string *)((long)&(pbVar3->_M_dataplus)._M_p + lVar5),filename);
      ExpandFilePath(__return_storage_ptr__,psVar4,extraout_RDX);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        psVar4 = (string *)(local_50.field_2._M_allocated_capacity + 1);
        operator_delete(local_50._M_dataplus._M_p,(ulong)psVar4);
      }
      bVar2 = FileExists(__return_storage_ptr__,psVar4);
      if (bVar2) {
        if (bVar7) {
          return __return_storage_ptr__;
        }
        break;
      }
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar1,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      pbVar3 = (search_paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
      bVar7 = uVar6 < (ulong)((long)(search_paths->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)
      ;
    } while (bVar7);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string FindFile(const std::string &filename,
                     const std::vector<std::string> &search_paths) {
  // TODO: Use ghc filesystem?

  if (filename.empty()) {
    return filename;
  }

  if (search_paths.empty()) {
    std::string absPath = io::ExpandFilePath(filename, /* userdata */ nullptr);
    if (io::FileExists(absPath, /* userdata */ nullptr)) {
      return absPath;
    }
  }

  for (size_t i = 0; i < search_paths.size(); i++) {
    std::string absPath = io::ExpandFilePath(
        io::JoinPath(search_paths[i], filename), /* userdata */ nullptr);
    if (io::FileExists(absPath, /* userdata */ nullptr)) {
      return absPath;
    }
  }

  return std::string();
}